

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadClass.cpp
# Opt level: O1

void * sznet::detail::startThread(void *obj)

{
  ThreadData::runInThread((ThreadData *)obj);
  if (*(void **)((long)obj + 0x20) != (void *)((long)obj + 0x30)) {
    operator_delete(*(void **)((long)obj + 0x20));
  }
  if (*(code **)((long)obj + 0x10) != (code *)0x0) {
    (**(code **)((long)obj + 0x10))(obj,obj,3);
  }
  operator_delete(obj);
  return (void *)0x0;
}

Assistant:

sz_thread_func_return startThread(void* obj)
{
	ThreadData* data = static_cast<ThreadData*>(obj);
	data->runInThread();
	delete data;
	data = nullptr;

	return 0;
}